

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

int64_t __thiscall obx::Transaction::getDataSizeChange(Transaction *this)

{
  obx_err err;
  OBX_txn *pOVar1;
  int64_t local_18;
  int64_t sizeChange;
  Transaction *this_local;
  
  local_18 = 0;
  sizeChange = (int64_t)this;
  pOVar1 = cPtr(this);
  err = obx_txn_data_size(pOVar1,0,&local_18);
  internal::checkErrOrThrow(err);
  return local_18;
}

Assistant:

int64_t Transaction::getDataSizeChange() const {
    int64_t sizeChange = 0;
    internal::checkErrOrThrow(obx_txn_data_size(cPtr(), nullptr, &sizeChange));
    return sizeChange;
}